

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstdpp.hpp
# Opt level: O0

size_buffer_t
zstdpp::inplace::compress(buffer_t *data,buffer_t *buffer,compress_level_t compress_level)

{
  size_type sVar1;
  uchar *puVar2;
  uchar *puVar3;
  size_type sVar4;
  size_t compress_size;
  size_t est_compress_size;
  compress_level_t compress_level_local;
  buffer_t *buffer_local;
  buffer_t *data_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  sVar1 = ZSTD_compressBound(sVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,sVar1);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(buffer);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(data);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  sVar1 = ZSTD_compress(puVar2,sVar1,puVar3,sVar4,compress_level);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,sVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::shrink_to_fit(buffer);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(buffer);
  return sVar1;
}

Assistant:

inline size_buffer_t compress(
        buffer_t const& data,
        buffer_t& buffer,
        compress_level_t compress_level = 3
    ) {
      size_t est_compress_size = ZSTD_compressBound(data.size());
    
      buffer.resize(est_compress_size);
    
      auto compress_size = ZSTD_compress((void*)buffer.data(), est_compress_size,
                                         data.data(), data.size(), compress_level);
    
      buffer.resize(compress_size);
      buffer.shrink_to_fit();
    
      return buffer.size();
    }